

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scanner.c
# Opt level: O0

int yaml_parser_scan_tag_uri
              (yaml_parser_t *parser,int directive,yaml_char_t *head,yaml_mark_t start_mark,
              yaml_char_t **uri)

{
  yaml_char_t *pyVar1;
  int iVar2;
  yaml_char_t *pyVar3;
  char *context;
  bool bVar4;
  yaml_char_t *local_60;
  undefined1 local_50 [8];
  yaml_string_t string;
  size_t length;
  yaml_char_t **uri_local;
  yaml_char_t *head_local;
  int directive_local;
  yaml_parser_t *parser_local;
  
  if (head == (yaml_char_t *)0x0) {
    local_60 = (yaml_char_t *)0x0;
  }
  else {
    local_60 = (yaml_char_t *)strlen((char *)head);
  }
  string.pointer = local_60;
  memset(local_50,0,0x18);
  local_50 = (undefined1  [8])yaml_malloc(0x10);
  if (local_50 == (undefined1  [8])0x0) {
    parser->error = YAML_MEMORY_ERROR;
  }
  else {
    string.start = (yaml_char_t *)((long)local_50 + 0x10);
    string.end = (yaml_char_t *)local_50;
    memset((void *)local_50,0,0x10);
    do {
      if (string.pointer < string.start + -(long)local_50) {
        if ((yaml_char_t *)0x1 < string.pointer) {
          memcpy((void *)local_50,head + 1,(size_t)(string.pointer + -1));
          string.end = string.pointer + -1 + (long)string.end;
        }
        if ((parser->unread != 0) || (iVar2 = yaml_parser_update_buffer(parser,1), iVar2 != 0))
        goto LAB_0011386f;
        goto LAB_00113fe5;
      }
      iVar2 = yaml_string_extend((yaml_char_t **)local_50,&string.end,&string.start);
    } while (iVar2 != 0);
    parser->error = YAML_MEMORY_ERROR;
  }
  goto LAB_00113fe5;
  while( true ) {
    if (*(parser->buffer).pointer == '%') {
      if ((string.start <= string.end + 5) &&
         (iVar2 = yaml_string_extend((yaml_char_t **)local_50,&string.end,&string.start), iVar2 == 0
         )) {
        parser->error = YAML_MEMORY_ERROR;
        break;
      }
      iVar2 = yaml_parser_scan_uri_escapes(parser,directive,start_mark,(yaml_string_t *)local_50);
      if (iVar2 == 0) break;
    }
    else {
      if ((string.start <= string.end + 5) &&
         (iVar2 = yaml_string_extend((yaml_char_t **)local_50,&string.end,&string.start), iVar2 == 0
         )) {
        parser->error = YAML_MEMORY_ERROR;
        break;
      }
      if ((*(parser->buffer).pointer & 0x80) == 0) {
        pyVar1 = (parser->buffer).pointer;
        (parser->buffer).pointer = pyVar1 + 1;
        *string.end = *pyVar1;
        string.end = string.end + 1;
      }
      else if ((*(parser->buffer).pointer & 0xe0) == 0xc0) {
        pyVar1 = (parser->buffer).pointer;
        (parser->buffer).pointer = pyVar1 + 1;
        pyVar3 = string.end + 1;
        *string.end = *pyVar1;
        pyVar1 = (parser->buffer).pointer;
        (parser->buffer).pointer = pyVar1 + 1;
        string.end = string.end + 2;
        *pyVar3 = *pyVar1;
      }
      else if ((*(parser->buffer).pointer & 0xf0) == 0xe0) {
        pyVar1 = (parser->buffer).pointer;
        (parser->buffer).pointer = pyVar1 + 1;
        *string.end = *pyVar1;
        pyVar1 = (parser->buffer).pointer;
        (parser->buffer).pointer = pyVar1 + 1;
        pyVar3 = string.end + 2;
        string.end[1] = *pyVar1;
        pyVar1 = (parser->buffer).pointer;
        (parser->buffer).pointer = pyVar1 + 1;
        string.end = string.end + 3;
        *pyVar3 = *pyVar1;
      }
      else if ((*(parser->buffer).pointer & 0xf8) == 0xf0) {
        pyVar1 = (parser->buffer).pointer;
        (parser->buffer).pointer = pyVar1 + 1;
        *string.end = *pyVar1;
        pyVar1 = (parser->buffer).pointer;
        (parser->buffer).pointer = pyVar1 + 1;
        string.end[1] = *pyVar1;
        pyVar1 = (parser->buffer).pointer;
        (parser->buffer).pointer = pyVar1 + 1;
        pyVar3 = string.end + 3;
        string.end[2] = *pyVar1;
        pyVar1 = (parser->buffer).pointer;
        (parser->buffer).pointer = pyVar1 + 1;
        string.end = string.end + 4;
        *pyVar3 = *pyVar1;
      }
      (parser->mark).index = (parser->mark).index + 1;
      (parser->mark).column = (parser->mark).column + 1;
      parser->unread = parser->unread - 1;
    }
    string.pointer = string.pointer + 1;
    if ((parser->unread == 0) && (iVar2 = yaml_parser_update_buffer(parser,1), iVar2 == 0)) break;
LAB_0011386f:
    if (((((*(parser->buffer).pointer < 0x30) || (bVar4 = true, 0x39 < *(parser->buffer).pointer))
         && (((*(parser->buffer).pointer < 0x41 || (bVar4 = true, 0x5a < *(parser->buffer).pointer))
             && ((*(parser->buffer).pointer < 0x61 ||
                 (bVar4 = true, 0x7a < *(parser->buffer).pointer)))))) &&
        ((((((((bVar4 = true, *(parser->buffer).pointer != '_' &&
               (bVar4 = true, *(parser->buffer).pointer != '-')) &&
              (bVar4 = true, *(parser->buffer).pointer != ';')) &&
             ((bVar4 = true, *(parser->buffer).pointer != '/' &&
              (bVar4 = true, *(parser->buffer).pointer != '?')))) &&
            (bVar4 = true, *(parser->buffer).pointer != ':')) &&
           (((bVar4 = true, *(parser->buffer).pointer != '@' &&
             (bVar4 = true, *(parser->buffer).pointer != '&')) &&
            ((bVar4 = true, *(parser->buffer).pointer != '=' &&
             (((bVar4 = true, *(parser->buffer).pointer != '+' &&
               (bVar4 = true, *(parser->buffer).pointer != '$')) &&
              (bVar4 = true, *(parser->buffer).pointer != ',')))))))) &&
          ((bVar4 = true, *(parser->buffer).pointer != '.' &&
           (bVar4 = true, *(parser->buffer).pointer != '!')))) &&
         (bVar4 = true, *(parser->buffer).pointer != '~')))) &&
       (((bVar4 = true, *(parser->buffer).pointer != '*' &&
         (bVar4 = true, *(parser->buffer).pointer != '\'')) &&
        ((bVar4 = true, *(parser->buffer).pointer != '(' &&
         (((bVar4 = true, *(parser->buffer).pointer != ')' &&
           (bVar4 = true, *(parser->buffer).pointer != '[')) &&
          (bVar4 = true, *(parser->buffer).pointer != ']')))))))) {
      bVar4 = *(parser->buffer).pointer == '%';
    }
    if (!bVar4) {
      if (string.pointer != (yaml_char_t *)0x0) {
        *uri = (yaml_char_t *)local_50;
        return 1;
      }
      if ((string.end + 5 < string.start) ||
         (iVar2 = yaml_string_extend((yaml_char_t **)local_50,&string.end,&string.start), iVar2 != 0
         )) {
        context = "while parsing a tag";
        if (directive != 0) {
          context = "while parsing a %TAG directive";
        }
        yaml_parser_set_scanner_error(parser,context,start_mark,"did not find expected tag URI");
      }
      else {
        parser->error = YAML_MEMORY_ERROR;
      }
      break;
    }
  }
LAB_00113fe5:
  yaml_free((void *)local_50);
  return 0;
}

Assistant:

static int
yaml_parser_scan_tag_uri(yaml_parser_t *parser, int directive,
        yaml_char_t *head, yaml_mark_t start_mark, yaml_char_t **uri)
{
    size_t length = head ? strlen((char *)head) : 0;
    yaml_string_t string = NULL_STRING;

    if (!STRING_INIT(parser, string, INITIAL_STRING_SIZE)) goto error;

    /* Resize the string to include the head. */

    while ((size_t)(string.end - string.start) <= length) {
        if (!yaml_string_extend(&string.start, &string.pointer, &string.end)) {
            parser->error = YAML_MEMORY_ERROR;
            goto error;
        }
    }

    /*
     * Copy the head if needed.
     *
     * Note that we don't copy the leading '!' character.
     */

    if (length > 1) {
        memcpy(string.start, head+1, length-1);
        string.pointer += length-1;
    }

    /* Scan the tag. */

    if (!CACHE(parser, 1)) goto error;

    /*
     * The set of characters that may appear in URI is as follows:
     *
     *      '0'-'9', 'A'-'Z', 'a'-'z', '_', '-', ';', '/', '?', ':', '@', '&',
     *      '=', '+', '$', ',', '.', '!', '~', '*', '\'', '(', ')', '[', ']',
     *      '%'.
     */

    while (IS_ALPHA(parser->buffer) || CHECK(parser->buffer, ';')
            || CHECK(parser->buffer, '/') || CHECK(parser->buffer, '?')
            || CHECK(parser->buffer, ':') || CHECK(parser->buffer, '@')
            || CHECK(parser->buffer, '&') || CHECK(parser->buffer, '=')
            || CHECK(parser->buffer, '+') || CHECK(parser->buffer, '$')
            || CHECK(parser->buffer, ',') || CHECK(parser->buffer, '.')
            || CHECK(parser->buffer, '!') || CHECK(parser->buffer, '~')
            || CHECK(parser->buffer, '*') || CHECK(parser->buffer, '\'')
            || CHECK(parser->buffer, '(') || CHECK(parser->buffer, ')')
            || CHECK(parser->buffer, '[') || CHECK(parser->buffer, ']')
            || CHECK(parser->buffer, '%'))
    {
        /* Check if it is a URI-escape sequence. */

        if (CHECK(parser->buffer, '%')) {
            if (!STRING_EXTEND(parser, string))
                goto error;

            if (!yaml_parser_scan_uri_escapes(parser,
                        directive, start_mark, &string)) goto error;
        }
        else {
            if (!READ(parser, string)) goto error;
        }

        length ++;
        if (!CACHE(parser, 1)) goto error;
    }

    /* Check if the tag is non-empty. */

    if (!length) {
        if (!STRING_EXTEND(parser, string))
            goto error;

        yaml_parser_set_scanner_error(parser, directive ?
                "while parsing a %TAG directive" : "while parsing a tag",
                start_mark, "did not find expected tag URI");
        goto error;
    }

    *uri = string.start;

    return 1;

error:
    STRING_DEL(parser, string);
    return 0;
}